

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,int num_digits,string_view prefix,format_specs specs,bin_writer<1> f)

{
  ulong uVar1;
  ulong uVar2;
  format_specs local_50;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::bin_writer<1>_>
  local_40;
  
  local_40.prefix.size_ = prefix.size_;
  local_40.prefix.data_ = prefix.data_;
  uVar2 = (uint)num_digits + local_40.prefix.size_;
  local_50._9_1_ = specs._9_1_;
  local_50.fill.data_[0] = specs.fill.data_[0];
  local_40.size_ = uVar2;
  local_40.fill = local_50.fill.data_[0];
  if ((local_50._9_1_ & 0xf) == 4) {
    uVar1 = specs._0_8_ & 0xffffffff;
    local_40.padding = 0;
    if (uVar2 <= uVar1) {
      local_40.size_ = uVar1;
      local_40.padding = uVar1 - uVar2;
    }
  }
  else {
    local_50.precision = specs.precision;
    if (num_digits < local_50.precision) {
      local_40.size_ = (uint)local_50.precision + local_40.prefix.size_;
      local_40.padding = (ulong)(uint)(local_50.precision - num_digits);
      local_40.fill = '0';
    }
    else {
      local_40.padding = 0;
    }
  }
  local_50._8_8_ = specs._8_8_;
  if (((undefined1  [16])specs & (undefined1  [16])0xf00) == (undefined1  [16])0x0) {
    local_50._8_8_ = specs._8_8_ | 0x200;
  }
  local_40.f.abs_value = f.abs_value;
  local_40.f.num_digits = f.num_digits;
  local_40.f._12_4_ = f._12_4_;
  local_50._0_8_ = specs._0_8_;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::bin_writer<1>>>
            (this,&local_50,&local_40);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }